

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

void __thiscall EmmyFacade::Hook(EmmyFacade *this,lua_State *L,lua_Debug *ar)

{
  EmmyDebuggerManager *this_00;
  Transporter *this_01;
  bool bVar1;
  reference this_02;
  initializer_list_t init;
  shared_ptr<Debugger> debugger;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  obj;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  lua_State *local_30;
  
  this_00 = &this->_emmyDebuggerManager;
  EmmyDebuggerManager::GetDebugger((EmmyDebuggerManager *)&debugger,(lua_State *)this_00);
  if (debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (this->workMode == Attach) {
      EmmyDebuggerManager::AddDebugger((EmmyDebuggerManager *)&obj,(lua_State *)this_00);
      std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)&obj);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&obj.m_value);
      install_emmy_debugger(L);
      bVar1 = EmmyDebuggerManager::IsRunning(this_00);
      if (bVar1) {
        Debugger::Start(debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Debugger::Attach(debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      init._M_len = 0;
      init._M_array = (iterator)&obj;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::object(init);
      local_30 = L;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<long,_long,_0>(&local_40,(long *)&local_30);
      this_02 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&obj,"state");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(this_02,&local_40);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_40);
      this_01 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_50,&obj);
      Transporter::Send(this_01,0xe,&local_50);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_50);
      Debugger::Hook(debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ar,L);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&obj);
    }
  }
  else {
    bVar1 = Debugger::IsRunning(debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (bVar1) {
      Debugger::Hook(debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ar,L);
    }
    else if (this->workMode == EmmyCore) {
      if (luaVersion != LUA_JIT) {
        bVar1 = Debugger::IsMainCoroutine
                          (debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           L);
        if (!bVar1) goto LAB_001495cf;
      }
      (*lua_sethook)(L,ReadyLuaHook,7,0);
    }
  }
LAB_001495cf:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void EmmyFacade::Hook(lua_State *L, lua_Debug *ar) {
	auto debugger = GetDebugger(L);
	if (debugger) {
		if (!debugger->IsRunning()) {
			if (GetWorkMode() == WorkMode::EmmyCore) {
				if (luaVersion != LuaVersion::LUA_JIT) {
					if (debugger->IsMainCoroutine(L)) {
						SetReadyHook(L);
					}
				} else {
					SetReadyHook(L);
				}
			}
			return;
		}

		debugger->Hook(ar, L);
	} else {
		if (workMode == WorkMode::Attach) {
			debugger = _emmyDebuggerManager.AddDebugger(L);
			install_emmy_debugger(L);
			if (_emmyDebuggerManager.IsRunning()) {
				debugger->Start();
				debugger->Attach();
			}
			// send attached notify
			auto obj = nlohmann::json::object();
			obj["state"] = reinterpret_cast<int64_t>(L);

			this->transporter->Send(int(MessageCMD::AttachedNotify), obj);

			debugger->Hook(ar, L);
		}
	}
}